

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O3

int coda_cursor_goto(coda_cursor_conflict *cursor,char *path)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long index;
  coda_type *type;
  int n;
  long local_48;
  coda_type *local_40;
  int local_34;
  
  local_40 = (coda_type *)0x0;
  uVar10 = 0;
  if (*path == '/') {
    iVar2 = coda_cursor_goto_root(cursor);
    if (iVar2 != 0) {
      return -1;
    }
    uVar5 = (byte)path[1] - 0x2f;
    if (((uVar5 < 0x2d) && ((0x100000020001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) || (path[1] == 0))
    {
      uVar10 = 1;
    }
  }
LAB_0010ee29:
  iVar2 = (int)uVar10;
  lVar8 = (long)iVar2;
  bVar1 = path[lVar8];
  if (bVar1 < 0x40) {
    if (bVar1 != 0x2f) {
      if (bVar1 == 0) {
        return 0;
      }
      goto LAB_0010ef8e;
    }
    uVar11 = (ulong)(iVar2 + 1U);
    lVar8 = (long)(int)(iVar2 + 1U);
  }
  else {
    if (bVar1 == 0x5b) {
      pcVar7 = path + (iVar2 + 1);
      uVar10 = 0;
      while( true ) {
        if (pcVar7[uVar10] == '\0') {
          pcVar7 = "invalid path \'%s\' (missing \']\')";
          goto LAB_0010f0d8;
        }
        if (pcVar7[uVar10] == ']') break;
        uVar10 = uVar10 + 1;
      }
      if ((int)uVar10 == 0) {
        coda_set_error(-100,"invalid array index \'\' in path");
        return -1;
      }
      iVar3 = __isoc99_sscanf(pcVar7,"%ld%n",&local_48);
      if ((iVar3 != 1) || (local_34 != (int)uVar10)) {
        coda_set_error(-100,"invalid array index \'%.*s\' in path",uVar10 & 0xffffffff,pcVar7);
        return -1;
      }
      iVar3 = coda_cursor_goto_array_element_by_index(cursor,local_48);
      if (iVar3 != 0) {
        return -1;
      }
      uVar10 = (iVar2 + 2) + uVar10;
      goto LAB_0010ee29;
    }
    if (bVar1 == 0x40) {
      iVar3 = coda_cursor_goto_attributes(cursor);
      if (iVar3 != 0) {
        return -1;
      }
      uVar5 = iVar2 + 1;
      lVar8 = 0;
      while( true ) {
        bVar1 = (path + (int)uVar5)[lVar8];
        uVar9 = bVar1 - 0x2f;
        if (((uVar9 < 0x2d) && ((0x100000020001U >> ((ulong)uVar9 & 0x3f) & 1) != 0)) ||
           (bVar1 == 0)) break;
        lVar8 = lVar8 + 1;
      }
      uVar10 = (ulong)uVar5 + lVar8;
      iVar3 = (int)lVar8;
      if ((iVar3 == 1) && (path[(int)uVar5] == '.')) {
LAB_0010ef80:
        uVar10 = uVar10 & 0xffffffff;
      }
      else {
        if ((iVar3 == 2) && ((path[(int)uVar5] == '.' && (path[(long)iVar2 + 2] == '.')))) {
          iVar2 = coda_cursor_goto_parent(cursor);
        }
        else {
          if ((int)uVar10 <= (int)uVar5) goto LAB_0010ef80;
          iVar2 = coda_cursor_get_type(cursor,&local_40);
          if (iVar2 != 0) {
            return -1;
          }
          iVar2 = coda_type_get_record_field_index_from_name_n
                            (local_40,path + (int)uVar5,iVar3,&local_48);
          if (iVar2 != 0) {
            return -1;
          }
          iVar2 = coda_cursor_goto_record_field_by_index(cursor,local_48);
        }
        if (iVar2 != 0) {
          return -1;
        }
        uVar10 = uVar10 & 0xffffffff;
      }
      goto LAB_0010ee29;
    }
LAB_0010ef8e:
    uVar11 = uVar10;
    if (0 < iVar2) {
      pcVar7 = "invalid path \'%s\' (missing \'/\'?)";
LAB_0010f0d8:
      coda_set_error(-100,pcVar7,path);
      return -1;
    }
  }
  uVar12 = uVar11 & 0xffffffff;
  lVar6 = 0;
  pcVar7 = path;
  while( true ) {
    uVar5 = (byte)pcVar7[lVar8] - 0x2f;
    if (((uVar5 < 0x2d) && ((0x100000020001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
       (pcVar7[lVar8] == 0)) break;
    lVar6 = lVar6 + -1;
    uVar12 = uVar12 - 1;
    pcVar7 = pcVar7 + 1;
  }
  uVar10 = lVar8 - lVar6;
  iVar2 = (int)lVar8;
  iVar3 = (int)uVar12;
  if ((iVar2 + -1 != iVar3) || (path[lVar8] != '.')) {
    if ((iVar2 + -2 == iVar3) && ((path[lVar8] == '.' && (path[(long)(int)uVar11 + 1] == '.')))) {
      iVar2 = coda_cursor_goto_parent(cursor);
      if (iVar2 != 0) {
        return -1;
      }
    }
    else {
      iVar4 = coda_cursor_get_type(cursor,&local_40);
      if (iVar4 != 0) {
        return -1;
      }
      iVar2 = coda_type_get_record_field_index_from_name_n
                        (local_40,path + lVar8,iVar2 - iVar3,&local_48);
      if (iVar2 != 0) {
        return -1;
      }
      iVar2 = coda_cursor_goto_record_field_by_index(cursor,local_48);
      if (iVar2 != 0) {
        return -1;
      }
    }
  }
  goto LAB_0010ee29;
}

Assistant:

LIBCODA_API int coda_cursor_goto(coda_cursor *cursor, const char *path)
{
    coda_type *type = NULL;
    long index;
    int start = 0;
    int end;

    if (path[start] == '/')
    {
        if (coda_cursor_goto_root(cursor) != 0)
        {
            return -1;
        }
        /* skip leading '/' if it is not followed by a record field name */
        if (path[start + 1] == '\0' || path[start + 1] == '/' || path[start + 1] == '[' || path[start + 1] == '@')
        {
            start++;
        }
    }

    while (path[start] != '\0')
    {
        if (path[start] == '@')
        {
            /* attribute */
            if (coda_cursor_goto_attributes(cursor) != 0)
            {
                return -1;
            }
            start++;
            end = start;
            while (path[end] != '\0' && path[end] != '/' && path[end] != '[' && path[end] != '@')
            {
                end++;
            }
            if (end == start + 1 && path[start] == '.')
            {
                /* stay at this position */
            }
            else if (end == start + 2 && path[start] == '.' && path[start + 1] == '.')
            {
                if (coda_cursor_goto_parent(cursor) != 0)
                {
                    return -1;
                }
            }
            else if (end > start)
            {
                if (coda_cursor_get_type(cursor, &type) != 0)
                {
                    return -1;
                }
                if (coda_type_get_record_field_index_from_name_n(type, &path[start], end - start, &index) != 0)
                {
                    return -1;
                }
                if (coda_cursor_goto_record_field_by_index(cursor, index) != 0)
                {
                    return -1;
                }
            }
            start = end;
        }
        else if (path[start] == '[')
        {
            int result;
            int n;

            /* array index */
            start++;
            end = start;
            while (path[end] != '\0' && path[end] != ']')
            {
                end++;
            }
            if (path[end] == '\0')
            {
                coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid path '%s' (missing ']')", path);
                return -1;
            }
            if (start == end)
            {
                coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid array index '' in path");
                return -1;
            }
            result = sscanf(&path[start], "%ld%n", &index, &n);
            if (result != 1 || n != end - start)
            {
                coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid array index '%.*s' in path", end - start,
                               &path[start]);
                return -1;
            }
            if (coda_cursor_goto_array_element_by_index(cursor, index) != 0)
            {
                return -1;
            }
            start = end + 1;
        }
        else
        {
            /* it is Ok to ommit a leading '/' when we start with a field name */
            if (path[start] == '/')
            {
                start++;
            }
            else if (start > 0)
            {
                coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid path '%s' (missing '/'?)", path);
                return -1;
            }
            end = start;
            while (path[end] != '\0' && path[end] != '/' && path[end] != '[' && path[end] != '@')
            {
                end++;
            }
            if (end == start + 1 && path[start] == '.')
            {
                /* stay at this position */
            }
            else if (end == start + 2 && path[start] == '.' && path[start + 1] == '.')
            {
                if (coda_cursor_goto_parent(cursor) != 0)
                {
                    return -1;
                }
            }
            else
            {
                if (coda_cursor_get_type(cursor, &type) != 0)
                {
                    return -1;
                }
                if (coda_type_get_record_field_index_from_name_n(type, &path[start], end - start, &index) != 0)
                {
                    return -1;
                }
                if (coda_cursor_goto_record_field_by_index(cursor, index) != 0)
                {
                    return -1;
                }
            }
            start = end;
        }
    }

    return 0;
}